

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsprintf.c
# Opt level: O3

int vsprintf_s(char *_Dst,size_t _SizeInBytes,char *_Format,__va_list_tag *_ArgList)

{
  tSafeCRT_AssertFuncPtr p_Var1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  size_t sVar5;
  __va_list_tag *in_R8;
  ulong uVar6;
  
  if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0 || _Format != (char *)0x0) {
    if (_Format != (char *)0x0) {
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 &&
          (_SizeInBytes == 0 || _Dst == (char *)0x0)) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInBytes > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                   ,0x85);
      }
      if (_SizeInBytes == 0 || _Dst == (char *)0x0) {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
          return -1;
        }
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInBytes > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                   ,0x85);
        return -1;
      }
      iVar2 = _vsnprintf_helper((OUTPUTFN)_Dst,(char *)_SizeInBytes,(size_t)_Format,(char *)_ArgList
                                ,in_R8);
      if (-1 < iVar2) {
        if (_SizeInBytes == 0xffffffffffffffff) {
          return iVar2;
        }
        if (_SizeInBytes == 0x7fffffff) {
          return iVar2;
        }
        uVar4 = (ulong)(iVar2 + 1);
        uVar6 = _SizeInBytes - uVar4;
        if (_SizeInBytes < uVar4 || uVar6 == 0) {
          return iVar2;
        }
        sVar5 = 8;
        if (uVar6 < 8) {
          sVar5 = uVar6;
        }
        memset(_Dst + uVar4,0xfd,sVar5);
        return iVar2;
      }
      *_Dst = '\0';
      if (((_SizeInBytes != 0xffffffffffffffff) && (_SizeInBytes != 1)) &&
         (_SizeInBytes != 0x7fffffff)) {
        sVar5 = 8;
        if (_SizeInBytes - 1 < 8) {
          sVar5 = _SizeInBytes - 1;
        }
        memset(_Dst + 1,0xfd,sVar5);
      }
      if (iVar2 != -2) {
        return iVar2;
      }
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        piVar3 = __errno_location();
        *piVar3 = 0x22;
        return -1;
      }
      (*sMBUSafeCRTAssertFunc)
                ("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                 ,0x8f);
      p_Var1 = sMBUSafeCRTAssertFunc;
      piVar3 = __errno_location();
      *piVar3 = 0x22;
      if (p_Var1 == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      (*p_Var1)("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                ,0x8f);
      return -1;
    }
  }
  else {
    (*sMBUSafeCRTAssertFunc)
              ("\"format != NULL\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
               ,0x84);
  }
  p_Var1 = sMBUSafeCRTAssertFunc;
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  if (p_Var1 != (tSafeCRT_AssertFuncPtr)0x0) {
    (*p_Var1)("\"format != NULL\"","SafeCRT assert failed",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
              ,0x84);
  }
  return -1;
}

Assistant:

int __cdecl _vsprintf_s (
        char *string,
        size_t sizeInBytes,
        const char *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInBytes > 0, EINVAL, -1);

    retvalue = _vsnprintf_helper(_output_s, string, sizeInBytes, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInBytes, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInBytes, retvalue + 1);
    }

    return retvalue;
}